

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::HairSetNode::convert_bezier_to_bspline(HairSetNode *this)

{
  size_t *psVar1;
  pointer pvVar2;
  pointer pHVar3;
  size_t sVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  avector<Vec3ff> local_50;
  
  if ((this->type & ~RTC_GEOMETRY_TYPE_QUAD) == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE) {
    lVar6 = 0;
    for (uVar7 = 0;
        pvVar2 = (this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(this->positions).
                              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 5);
        uVar7 = uVar7 + 1) {
      bezier_to_bspline_helper
                (&local_50,&this->hairs,(avector<Vec3ff> *)(&pvVar2->field_0x0 + lVar6));
      pvVar2 = (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      alignedFree(*(void **)((long)&pvVar2->items + lVar6));
      sVar4 = local_50.size_active;
      local_50.size_active = 0;
      psVar1 = (size_t *)((long)&pvVar2->size_active + lVar6);
      *psVar1 = sVar4;
      psVar1[1] = local_50.size_alloced;
      local_50.size_alloced = 0;
      *(Vec3fx **)((long)&pvVar2->items + lVar6) = local_50.items;
      alignedFree((void *)0x0);
      lVar6 = lVar6 + 0x20;
    }
    uVar7 = 0;
    for (uVar5 = 0;
        pHVar3 = (this->hairs).
                 super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->hairs).
                              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3);
        uVar5 = uVar5 + 1) {
      *(ulong *)((long)&pHVar3->vertex + uVar7 * 2) = uVar7 & 0xffffffff;
      uVar7 = uVar7 + 4;
    }
    this->type = this->type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE ^
                 RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::convert_bezier_to_bspline()
  {
    if (type != RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE &&
        type != RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
      return;

    for (size_t i=0; i<positions.size(); i++) {
      positions[i] = bezier_to_bspline_helper(hairs,positions[i]);
    }
    for (size_t i=0; i<hairs.size(); i++) {
      hairs[i] = SceneGraph::HairSetNode::Hair(unsigned(4*i),0);
    }

    if (type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
      type = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;
    else
      type = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
  }